

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void clear_refine(saucy *s)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < s->nninduce; lVar1 = lVar1 + 1) {
    s->indmark[s->ninduce[lVar1]] = '\0';
  }
  for (lVar1 = 0; lVar1 < s->nsinduce; lVar1 = lVar1 + 1) {
    s->indmark[s->sinduce[lVar1]] = '\0';
  }
  s->nninduce = 0;
  s->nsinduce = 0;
  return;
}

Assistant:

static void
clear_refine(struct saucy *s)
{
    int i;
    for (i = 0; i < s->nninduce; ++i) {
        s->indmark[s->ninduce[i]] = 0;
    }
    for (i = 0; i < s->nsinduce; ++i) {
        s->indmark[s->sinduce[i]] = 0;
    }
    s->nninduce = s->nsinduce = 0;
}